

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgap_dictionary.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> *
bwtil::cgap_dictionary::bitvector_to_gaps
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          vector<bool,_std::allocator<bool>_> *B)

{
  iterator iVar1;
  _Bit_type *p_Var2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_40 = 1;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = (B->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p;
  uVar3 = ((long)(B->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) * 8 +
          (ulong)(B->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_offset;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      uVar3 = uVar4 + 0x3f;
      if (-1 < (long)uVar4) {
        uVar3 = uVar4;
      }
      if ((p_Var2[((long)uVar3 >> 6) +
                  (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
           >> (uVar4 & 0x3f) & 1) == 0) {
        uVar5 = local_40 + 1;
      }
      else {
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          uVar5 = 1;
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                     iVar1,&local_40);
        }
        else {
          *iVar1._M_current = local_40;
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          uVar5 = 1;
        }
      }
      uVar4 = uVar4 + 1;
      p_Var2 = (B->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p;
      uVar3 = (ulong)(B->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(B->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2
              ) * 8;
      local_40 = uVar5;
    } while (uVar4 < uVar3);
  }
  uVar4 = uVar3 - 1;
  uVar3 = uVar3 + 0x3e;
  if (-1 < (long)uVar4) {
    uVar3 = uVar4;
  }
  if ((p_Var2[((long)uVar3 >> 6) +
              (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
       (uVar4 & 0x3f) & 1) == 0) {
    local_38 = local_40 - 1;
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (__return_storage_ptr__,iVar1,&local_38);
    }
    else {
      *iVar1._M_current = local_38;
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<ulint> bitvector_to_gaps(vector<bool> &B){

		ulint gap_len=1;
		vector<ulint> gaps;

		for(ulint i=0;i<B.size();++i){

			if(B[i]){

				gaps.push_back(gap_len);
				gap_len=1;

			}else{
				gap_len++;
			}

		}

		if(not B[B.size()-1])
			gaps.push_back(gap_len-1);

		assert(gaps.size()>0);

		return gaps;

	}